

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
initContents(PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
             *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  Entry *pEVar4;
  undefined8 *in_RDI;
  Entry *local_40;
  
  *(undefined4 *)(in_RDI + 1) = 0x10;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  uVar2 = CONCAT44(0,*(uint *)(in_RDI + 1));
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pEVar4 = (Entry *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_40 = pEVar4;
    do {
      Entry::Entry(local_40);
      local_40 = local_40 + 1;
    } while (local_40 != pEVar4 + uVar2);
  }
  *in_RDI = pEVar4;
  return;
}

Assistant:

void initContents()
    {
        _numEntries = 16;
        _size = 0;
        _entries = new Entry[_numEntries];
    }